

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.h
# Opt level: O1

int SetAllPWMsSSC32(SSC32 *pSSC32,int *selectedchannels,int *pws)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int *piVar6;
  byte bVar7;
  int pws_tmp [32];
  char sendbuf [512];
  char szTmp [512];
  int local_4b8 [32];
  uint8 local_438 [512];
  char local_238 [520];
  
  bVar7 = 0;
  memset(local_238,0,0x200);
  memset(local_438,0,0x200);
  piVar6 = local_4b8;
  for (lVar4 = 0x20; lVar4 != 0; lVar4 = lVar4 + -1) {
    *piVar6 = *pws;
    pws = pws + (ulong)bVar7 * -2 + 1;
    piVar6 = piVar6 + (ulong)bVar7 * -2 + 1;
  }
  uVar5 = 0;
  do {
    if (selectedchannels[uVar5] != 0) {
      if (pSSC32->bProportionalPWs[uVar5] == 0) {
        iVar3 = (int)((double)(local_4b8[uVar5] + -0x5dc) * pSSC32->CoefPWs[uVar5]) + 0x5dc;
      }
      else {
        iVar1 = (int)((double)(local_4b8[uVar5] + -0x5dc) * pSSC32->CoefPWs[uVar5]);
        local_4b8[uVar5] = iVar1;
        if (iVar1 < 0) {
          iVar3 = pSSC32->MidPWs[uVar5];
          iVar1 = (int)((ulong)((long)((pSSC32->MinPWs[uVar5] - iVar3) * iVar1) * -0x10624dd3) >>
                       0x20);
        }
        else {
          iVar3 = pSSC32->MidPWs[uVar5];
          iVar1 = (int)((ulong)((long)((pSSC32->MaxPWs[uVar5] - iVar3) * iVar1) * 0x10624dd3) >>
                       0x20);
        }
        iVar3 = ((iVar1 >> 5) - (iVar1 >> 0x1f)) + iVar3;
      }
      local_4b8[uVar5] = iVar3;
      if (pSSC32->MaxPWs[uVar5] <= iVar3) {
        iVar3 = pSSC32->MaxPWs[uVar5];
      }
      if (iVar3 <= pSSC32->MinPWs[uVar5]) {
        iVar3 = pSSC32->MinPWs[uVar5];
      }
      local_4b8[uVar5] = iVar3;
      iVar3 = iVar3 - pSSC32->LastPWs[uVar5];
      iVar1 = -iVar3;
      if (0 < iVar3) {
        iVar1 = iVar3;
      }
      if (pSSC32->ThresholdPWs[uVar5] <= iVar1) {
        sprintf(local_238,"#%dP%d",uVar5 & 0xffffffff);
        strcat((char *)local_438,local_238);
      }
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x20);
  if (local_438[0] != '\0') {
    sVar2 = strlen((char *)local_438);
    (local_438 + sVar2)[0] = '\r';
    (local_438 + sVar2)[1] = '\0';
    sVar2 = strlen((char *)local_438);
    iVar3 = WriteDataSSC32(pSSC32,local_438,(int)sVar2,pSSC32->bytedelayus);
    if (iVar3 != 0) {
      puts("Error writing data to a SSC32. ");
      return 1;
    }
    if ((pSSC32->bSaveRawData != 0) && ((FILE *)pSSC32->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_438,(long)(int)sVar2,1,(FILE *)pSSC32->pfSaveFile);
      fflush((FILE *)pSSC32->pfSaveFile);
    }
    lVar4 = 0;
    do {
      if (selectedchannels[lVar4] != 0) {
        iVar1 = local_4b8[lVar4] - pSSC32->LastPWs[lVar4];
        iVar3 = -iVar1;
        if (0 < iVar1) {
          iVar3 = iVar1;
        }
        if (pSSC32->ThresholdPWs[lVar4] <= iVar3) {
          pSSC32->LastPWs[lVar4] = local_4b8[lVar4];
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x20);
  }
  return 0;
}

Assistant:

inline int SetAllPWMsSSC32(SSC32* pSSC32, int* selectedchannels, int* pws)
{
	char szTmp[MAX_NB_BYTES_SSC32];
	char sendbuf[MAX_NB_BYTES_SSC32];
	int sendbuflen = 0;
	int channel = 0;
	int pws_tmp[NB_CHANNELS_PWM_SSC32];

	memset(szTmp, 0, sizeof(szTmp));

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));

	memcpy(pws_tmp, pws, sizeof(pws_tmp));

	for (channel = 0; channel < NB_CHANNELS_PWM_SSC32; channel++)
	{
		if (!selectedchannels[channel]) continue;

		if (pSSC32->bProportionalPWs[channel])
		{
			pws_tmp[channel] = (int)(pSSC32->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_SSC32));
			if (pws_tmp[channel] >= 0)
				pws_tmp[channel] = pSSC32->MidPWs[channel]+pws_tmp[channel]*(pSSC32->MaxPWs[channel]-pSSC32->MidPWs[channel])
				/(DEFAULT_MAX_PW_SSC32-DEFAULT_MID_PW_SSC32);
			else
				pws_tmp[channel] = pSSC32->MidPWs[channel]+pws_tmp[channel]*(pSSC32->MinPWs[channel]-pSSC32->MidPWs[channel])
				/(DEFAULT_MIN_PW_SSC32-DEFAULT_MID_PW_SSC32);
		}
		else
		{
			pws_tmp[channel] = DEFAULT_MID_PW_SSC32+(int)(pSSC32->CoefPWs[channel]*(pws_tmp[channel]-DEFAULT_MID_PW_SSC32));
		}

		pws_tmp[channel] = max(min(pws_tmp[channel], pSSC32->MaxPWs[channel]), pSSC32->MinPWs[channel]);
		//pws_tmp[channel] = max(min(pws_tmp[channel], DEFAULT_ABSOLUTE_MAX_PW_SSC32), DEFAULT_ABSOLUTE_MIN_PW_SSC32);

		// The requested PWM is only applied if it is slightly different from the current value.
		if (abs(pws_tmp[channel]-pSSC32->LastPWs[channel]) < pSSC32->ThresholdPWs[channel]) continue;

		//printf("%d %d %d %d %d\n", channel, pws_tmp[channel], pSSC32->LastPWs[channel], abs(pws_tmp[channel]-pSSC32->LastPWs[channel]), pSSC32->ThresholdPWs[channel]);

		sprintf(szTmp, "#%dP%d", channel, pws_tmp[channel]);
		strcat(sendbuf, szTmp);
	}

	if (sendbuf[0] == 0) return EXIT_SUCCESS;

	strcat(sendbuf, "\r");
	sendbuflen = (int)strlen(sendbuf);

	//printf("%s\n", sendbuf);

	if (WriteDataSSC32(pSSC32, (unsigned char*)sendbuf, sendbuflen, pSSC32->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a SSC32. \n");
		return EXIT_FAILURE;
	}
	if ((pSSC32->bSaveRawData)&&(pSSC32->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pSSC32->pfSaveFile);
		fflush(pSSC32->pfSaveFile);
	}

	for (channel = 0; channel < NB_CHANNELS_PWM_SSC32; channel++)
	{
		if (!selectedchannels[channel]) continue;

		// The requested PWM should have been only applied if it was slightly different from the current value.
		if (abs(pws_tmp[channel]-pSSC32->LastPWs[channel]) < pSSC32->ThresholdPWs[channel]) continue;

		// Update last known value.
		pSSC32->LastPWs[channel] = pws_tmp[channel];
	}

	return EXIT_SUCCESS;
}